

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3InsertBuiltinFuncs(FuncDef *aDef,int nDef)

{
  char *__s;
  uint uVar1;
  size_t sVar2;
  FuncDef *pFVar3;
  FuncDef **ppFVar4;
  long lVar5;
  ulong uVar6;
  int h;
  
  if (0 < nDef) {
    uVar6 = (ulong)(uint)nDef;
    do {
      __s = aDef->zName;
      if (__s == (char *)0x0) {
        uVar1 = 0;
      }
      else {
        sVar2 = strlen(__s);
        uVar1 = (uint)sVar2 & 0x3fffffff;
      }
      h = (int)((int)*__s + uVar1) % 0x17;
      pFVar3 = functionSearch(h,__s);
      if (pFVar3 == (FuncDef *)0x0) {
        aDef->pNext = (FuncDef *)0x0;
        ppFVar4 = sqlite3BuiltinFunctions.a + h;
        lVar5 = 0x30;
      }
      else {
        ppFVar4 = &pFVar3->pNext;
        lVar5 = 0x10;
      }
      *(FuncDef **)(&aDef->nArg + lVar5) = *ppFVar4;
      *ppFVar4 = aDef;
      aDef = aDef + 1;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3InsertBuiltinFuncs(
  FuncDef *aDef,      /* List of global functions to be inserted */
  int nDef            /* Length of the apDef[] list */
){
  int i;
  for(i=0; i<nDef; i++){
    FuncDef *pOther;
    const char *zName = aDef[i].zName;
    int nName = sqlite3Strlen30(zName);
    int h = (zName[0] + nName) % SQLITE_FUNC_HASH_SZ;
    assert( zName[0]>='a' && zName[0]<='z' );
    pOther = functionSearch(h, zName);
    if( pOther ){
      assert( pOther!=&aDef[i] && pOther->pNext!=&aDef[i] );
      aDef[i].pNext = pOther->pNext;
      pOther->pNext = &aDef[i];
    }else{
      aDef[i].pNext = 0;
      aDef[i].u.pHash = sqlite3BuiltinFunctions.a[h];
      sqlite3BuiltinFunctions.a[h] = &aDef[i];
    }
  }
}